

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.hpp
# Opt level: O0

void __thiscall
InstructionSet::x86::Instruction<true>::Instruction
          (Instruction<true> *this,Operation operation,Source source,Source destination,
          ScaleIndexBase sib,bool lock,AddressSize address_size,Source segment_override,
          DataSize data_size,DisplacementT displacement,ImmediateT operand)

{
  ushort uVar1;
  Source SVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  Source SVar6;
  Source SVar7;
  ushort uVar8;
  ImmediateT *local_68;
  ushort local_5c;
  DataPointer local_25;
  DataPointer local_23;
  Source local_21;
  int local_20;
  byte local_1c;
  Source local_1b;
  Source local_1a;
  Source segment;
  int extension;
  bool lock_local;
  Source destination_local;
  Source source_local;
  Operation operation_local;
  Instruction<true> *this_local;
  ScaleIndexBase sib_local;
  
  this->operation_ = operation;
  SVar6 = C0;
  if (displacement != 0) {
    SVar6 = 0x40;
  }
  SVar7 = C0;
  if (operand != 0) {
    SVar7 = 0x20;
  }
  local_1c = lock;
  local_1b = destination;
  local_1a = source;
  segment = operation;
  _extension = this;
  this_local._7_1_ = sib.sib_;
  if (source == Indirect) {
    SVar2 = ScaleIndexBase::operator_cast_to_unsigned_char
                      ((ScaleIndexBase *)((long)&this_local + 7));
    SVar2 = SVar2 & BH;
  }
  else {
    SVar2 = C0;
  }
  this->mem_exts_source_ = address_size << 7 | SVar6 | SVar7 | source | SVar2;
  uVar8 = 0;
  if ((local_1c & 1) != 0) {
    uVar8 = 0x2000;
  }
  bVar3 = ScaleIndexBase::operator_cast_to_unsigned_char((ScaleIndexBase *)((long)&this_local + 7));
  uVar1 = (ushort)local_1b;
  if (local_1b == Indirect) {
    bVar4 = ScaleIndexBase::operator_cast_to_unsigned_char
                      ((ScaleIndexBase *)((long)&this_local + 7));
    local_5c = bVar4 & 7;
  }
  else {
    local_5c = 0;
  }
  this->source_data_dest_sib_ =
       (ushort)data_size << 0xe | uVar8 | (bVar3 & 0xf8) << 2 | uVar1 | local_5c;
  local_68 = this->extensions_;
  do {
    *local_68 = 0;
    local_68 = local_68 + 1;
  } while ((Instruction<true> *)local_68 != this + 1);
  local_20 = 0;
  bVar5 = has_operand(this);
  if (bVar5) {
    this->extensions_[local_20] = operand;
    local_20 = local_20 + 1;
  }
  bVar5 = has_displacement(this);
  if (bVar5) {
    this->extensions_[local_20] = displacement;
    local_20 = local_20 + 1;
  }
  local_21 = segment_override;
  if (segment_override == None) {
    local_23 = Instruction<true>::source(this);
    local_21 = DataPointer::default_segment(&local_23);
  }
  if (local_21 == None) {
    local_25 = Instruction<true>::destination(this);
    local_21 = DataPointer::default_segment(&local_25);
  }
  if (local_21 == None) {
    local_21 = DS;
  }
  this->source_data_dest_sib_ = this->source_data_dest_sib_ | (local_21 & 7) << 10;
  return;
}

Assistant:

constexpr Instruction(
			Operation operation,
			Source source,
			Source destination,
			ScaleIndexBase sib,
			bool lock,
			AddressSize address_size,
			Source segment_override,
			DataSize data_size,
			DisplacementT displacement,
			ImmediateT operand) noexcept :
				operation_(operation),
				mem_exts_source_(uint8_t(
					(int(address_size) << 7) |
					(displacement ? 0x40 : 0x00) |
					(operand ? 0x20 : 0x00) |
					int(source) |
					(source == Source::Indirect ? (uint8_t(sib) & 7) : 0)
				)),
				source_data_dest_sib_(uint16_t(
					(int(data_size) << 14) |
					(lock ? (1 << 13) : 0) |
					((uint8_t(sib) & 0xf8) << 2) |
					int(destination) |
					(destination == Source::Indirect ? (uint8_t(sib) & 7) : 0)
				)) {
			// Decisions on whether to include operand, displacement and/or size extension words
			// have implicitly been made in the int packing above; honour them here.
			int extension = 0;
			if(has_operand()) {
				extensions_[extension] = operand;
				++extension;
			}
			if(has_displacement()) {
				extensions_[extension] = ImmediateT(displacement);
				++extension;
			}

			// Patch in a fully-resolved segment.
			Source segment = segment_override;
			if(segment == Source::None) segment = this->source().default_segment();
			if(segment == Source::None) segment = this->destination().default_segment();
			if(segment == Source::None) segment = Source::DS;
			source_data_dest_sib_ |= (int(segment)&7) << 10;
		}